

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O2

void Saig_MvPrintState(int Iter,Saig_MvMan_t *p)

{
  void *pvVar1;
  int i;
  
  printf("%3d : ",Iter);
  for (i = 0; i < p->vFlops->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vFlops,i);
    if (*(uint *)((long)pvVar1 + 8) >> 3 == 0x1ffffffe) {
      printf("    *");
    }
    else {
      printf("%5d");
    }
  }
  putchar(10);
  return;
}

Assistant:

void Saig_MvPrintState( int Iter, Saig_MvMan_t * p )
{
    Saig_MvObj_t * pEntry;
    int i;
    printf( "%3d : ", Iter );
    Vec_PtrForEachEntry( Saig_MvObj_t *, p->vFlops, pEntry, i )
    {
        if ( pEntry->Value == SAIG_UNDEF_VALUE )
            printf( "    *" );
        else
            printf( "%5d", pEntry->Value );
    }
    printf( "\n" );
}